

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

uint32_t asmjit::v1_14::CodeHolder_hashNameAndGetSize(char *name,size_t *nameSize)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  size_t i;
  size_t sVar7;
  
  sVar2 = *nameSize;
  if (sVar2 == 0) {
    return 0;
  }
  if (sVar2 != 0xffffffffffffffff) {
    sVar7 = 0;
    uVar5 = 0;
    do {
      if (name[sVar7] == 0) {
        return 0x11;
      }
      uVar5 = uVar5 * 0x1003f + (uint)(byte)name[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    return uVar5;
  }
  lVar3 = -1;
  uVar5 = 0;
  do {
    uVar4 = uVar5;
    lVar6 = lVar3;
    bVar1 = name[lVar6 + 1];
    lVar3 = lVar6 + 1;
    uVar5 = uVar4 * 0x1003f + (uint)bVar1;
  } while (bVar1 != 0);
  *nameSize = (lVar6 + 2) - (ulong)(bVar1 == 0);
  return uVar4;
}

Assistant:

static uint32_t CodeHolder_hashNameAndGetSize(const char* name, size_t& nameSize) noexcept {
  uint32_t hashCode = 0;
  if (nameSize == SIZE_MAX) {
    size_t i = 0;
    for (;;) {
      uint8_t c = uint8_t(name[i]);
      if (!c) break;
      hashCode = Support::hashRound(hashCode, c);
      i++;
    }
    nameSize = i;
  }
  else {
    for (size_t i = 0; i < nameSize; i++) {
      uint8_t c = uint8_t(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hashCode = Support::hashRound(hashCode, c);
    }
  }
  return hashCode;
}